

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O1

int add_attribute_octet(stack_st_X509_ATTRIBUTE *attrs,int nid,uchar *buffer,int len)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint len_00;
  char *pcVar4;
  ASN1_STRING *str;
  X509_ATTRIBUTE *pXVar5;
  BIO_METHOD *pBVar6;
  BIO *pBVar7;
  PKCS7 *pPVar8;
  char **b;
  stack_st_PKCS7_SIGNER_INFO *psVar9;
  FILE *pFVar10;
  FILE *pFVar11;
  X509_STORE *ctx;
  X509_STORE_CTX *ctx_00;
  FILE *pFVar12;
  FILE *b_00;
  size_t __n;
  X509 **ppXVar13;
  ulong uVar14;
  void *__src;
  char *pcVar15;
  ASN1_OBJECT *a;
  ASN1_TYPE *pAVar16;
  FILE *pFVar17;
  X509_NAME *pXVar18;
  X509_NAME *b_01;
  X509 *a_00;
  X509_EXTENSION *pXVar19;
  ulong uVar20;
  char **ppcVar21;
  EVP_PKEY **buffer_00;
  ulong uVar22;
  uint extraout_EDX;
  FILE *extraout_RDX;
  undefined8 uVar23;
  FILE *pFVar24;
  ASN1_STRING *pAVar25;
  char *pcVar26;
  int *piVar27;
  int *cert;
  long lVar28;
  char **ppcVar29;
  uint uStack_2634;
  PKCS7 *pPStack_2630;
  BIO *pBStack_2628;
  long lStack_2620;
  byte abStack_2618 [64];
  char acStack_25d8 [1024];
  char acStack_21d8 [1032];
  FILE *pFStack_1dd0;
  int *piStack_1dc8;
  FILE *pFStack_1dc0;
  FILE *pFStack_1db8;
  FILE *pFStack_1db0;
  FILE *pFStack_1da8;
  FILE *pFStack_1d98;
  FILE aFStack_1d90 [4];
  FILE *pFStack_1988;
  int *piStack_1980;
  FILE *pFStack_1978;
  FILE *pFStack_1970;
  FILE *pFStack_1968;
  FILE *pFStack_1960;
  FILE aFStack_1958 [4];
  FILE aFStack_1558 [4];
  char acStack_1158 [2056];
  FILE *pFStack_950;
  FILE *pFStack_948;
  FILE *pFStack_940;
  FILE *pFStack_938;
  FILE *pFStack_930;
  FILE *pFStack_928;
  FILE *pFStack_918;
  FILE *pFStack_910;
  FILE *pFStack_908;
  FILE *pFStack_900;
  FILE *pFStack_8f8;
  FILE *pFStack_8f0;
  code *pcStack_8e8;
  FILE *pFStack_8d8;
  FILE *pFStack_8d0;
  FILE *pFStack_8c8;
  FILE *pFStack_8c0;
  FILE *pFStack_8b8;
  FILE *pFStack_8b0;
  undefined1 auStack_8a0 [1040];
  ASN1_STRING *pAStack_490;
  FILE *pFStack_488;
  X509_STORE *pXStack_480;
  X509_STORE_CTX *pXStack_478;
  FILE *pFStack_470;
  FILE *pFStack_468;
  undefined1 auStack_460 [1032];
  stack_st_X509_ATTRIBUTE *psStack_58;
  ASN1_STRING *pAStack_50;
  
  pcVar26 = pname;
  if (d_flag != 0) {
    pcVar4 = OBJ_nid2sn(nid);
    printf("%s: adding octet attribute %s\n",pcVar26,pcVar4);
  }
  str = ASN1_STRING_new();
  pAVar25 = str;
  iVar2 = ASN1_STRING_set(str,buffer,len);
  if (0 < iVar2) {
    pXVar5 = X509_ATTRIBUTE_create(nid,4,str);
    OPENSSL_sk_push(attrs,pXVar5);
    return 0;
  }
  add_attribute_octet_cold_1();
  pFStack_468 = (FILE *)0x10cca2;
  psStack_58 = attrs;
  pAStack_50 = str;
  pBVar6 = BIO_s_mem();
  pFStack_468 = (FILE *)0x10ccaa;
  pBVar7 = BIO_new(pBVar6);
  if (v_flag != 0) {
    pFStack_468 = (FILE *)0x10ccd1;
    printf("%s: reading outer PKCS#7\n",pname);
  }
  pFStack_468 = (FILE *)0x10cce6;
  uVar3 = BIO_write(pBVar7,*(void **)(pAVar25 + 8),*(int *)&pAVar25[8].data);
  if ((int)uVar3 < 1) {
    pFStack_468 = (FILE *)0x10d070;
    pkcs7_verify_unwrap_cold_12();
LAB_0010d070:
    pFStack_468 = (FILE *)0x10d075;
    pkcs7_verify_unwrap_cold_11();
LAB_0010d075:
    pFStack_468 = (FILE *)0x10d07a;
    pkcs7_verify_unwrap_cold_1();
LAB_0010d07a:
    pFStack_468 = (FILE *)0x10d07f;
    pkcs7_verify_unwrap_cold_10();
  }
  else {
    if (v_flag != 0) {
      pFStack_468 = (FILE *)0x10cd14;
      printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
    }
    pFStack_468 = (FILE *)0x10cd21;
    BIO_set_flags(pBVar7,0x200);
    pFStack_468 = (FILE *)0x10cd2b;
    pPVar8 = d2i_PKCS7_bio(pBVar7,(PKCS7 **)0x0);
    pAVar25[7].flags = (long)pPVar8;
    if (pPVar8 == (PKCS7 *)0x0) goto LAB_0010d070;
    if (d_flag != 0) {
      pFStack_468 = (FILE *)0x10cd5f;
      printf("%s: printing PEM fomatted PKCS#7\n",pname);
      pFStack_468 = (FILE *)0x10cd75;
      PEM_write_PKCS7(_stdout,(PKCS7 *)pAVar25[7].flags);
    }
    pFStack_468 = (FILE *)0x10cd85;
    iVar2 = OBJ_obj2nid(*(ASN1_OBJECT **)(pAVar25[7].flags + 0x18));
    if (iVar2 != 0x16) goto LAB_0010d075;
    pFStack_468 = (FILE *)0x10cd9c;
    pBVar7 = PKCS7_dataInit((PKCS7 *)pAVar25[7].flags,(BIO *)0x0);
    if (pBVar7 == (BIO *)0x0) goto LAB_0010d07a;
    pFStack_468 = (FILE *)0x10cdad;
    pBVar6 = BIO_s_mem();
    pFStack_468 = (FILE *)0x10cdb5;
    b = (char **)BIO_new(pBVar6);
    pFStack_468 = (FILE *)0x10cdc8;
    uVar3 = BIO_read(pBVar7,auStack_460,0x400);
    len_00 = uVar3;
    while (0 < (int)len_00) {
      pFStack_468 = (FILE *)0x10cde0;
      BIO_write((BIO *)b,auStack_460,len_00);
      pFStack_468 = (FILE *)0x10cdf0;
      len_00 = BIO_read(pBVar7,auStack_460,0x400);
      uVar3 = uVar3 + len_00;
    }
    pFStack_468 = (FILE *)0x10ce07;
    BIO_ctrl((BIO *)b,0xb,0,(void *)0x0);
    if (v_flag != 0) {
      pFStack_468 = (FILE *)0x10ce2d;
      printf("%s: PKCS#7 contains %d bytes of signed data\n",pname,(ulong)uVar3);
    }
    pFStack_468 = (FILE *)0x10ce39;
    psVar9 = PKCS7_get_signer_info((PKCS7 *)pAVar25[7].flags);
    if (psVar9 != (stack_st_PKCS7_SIGNER_INFO *)0x0) {
      if (v_flag != 0) {
        pFStack_468 = (FILE *)0x10ce69;
        printf("%s: verifying signature\n",pname);
      }
      pFStack_468 = (FILE *)0x10ce73;
      pFVar10 = (FILE *)OPENSSL_sk_value(psVar9,0);
      pFStack_468 = (FILE *)0x10ce85;
      pFVar11 = (FILE *)PKCS7_cert_from_signer_info
                                  ((PKCS7 *)pAVar25[7].flags,(PKCS7_SIGNER_INFO *)pFVar10);
      if (pFVar11 == (FILE *)0x0) {
        pFStack_468 = (FILE *)0x10cea5;
        printf("%s: Can\'t read signer cert from pkcs7\n",pname);
      }
      pFStack_468 = (FILE *)0x10ceba;
      iVar2 = PKCS7_signatureVerify
                        (pBVar7,(PKCS7 *)pAVar25[7].flags,(PKCS7_SIGNER_INFO *)pFVar10,
                         (X509 *)pFVar11);
      if (iVar2 < 1) goto LAB_0010d084;
      if (v_flag != 0) {
        pFStack_468 = (FILE *)0x10cee6;
        printf("%s: signature ok\n");
      }
      pFStack_468 = (FILE *)0x10ceeb;
      ctx = X509_STORE_new();
      if (ctx == (X509_STORE *)0x0) {
        pFStack_468 = (FILE *)0x10d048;
        pkcs7_verify_unwrap_cold_2();
      }
      pFStack_468 = (FILE *)0x10cf01;
      X509_STORE_set_flags(ctx,0);
      pFStack_468 = (FILE *)0x10cf0e;
      X509_STORE_load_locations(ctx,(char *)buffer,(char *)0x0);
      pFStack_468 = (FILE *)0x10cf13;
      ctx_00 = X509_STORE_CTX_new();
      if (ctx_00 == (X509_STORE_CTX *)0x0) {
        pFStack_468 = (FILE *)0x10d052;
        pkcs7_verify_unwrap_cold_3();
      }
      buffer_00 = (EVP_PKEY **)0x0;
      pFStack_468 = (FILE *)0x10cf2f;
      iVar2 = X509_STORE_CTX_init(ctx_00,ctx,(X509 *)pFVar11,(stack_st_X509 *)0x0);
      if (iVar2 == 0) {
        pFStack_468 = (FILE *)0x10d05c;
        pkcs7_verify_unwrap_cold_4();
      }
      pFStack_468 = (FILE *)0x10cf3f;
      iVar2 = X509_verify_cert(ctx_00);
      if (iVar2 == 0) {
        pFStack_468 = (FILE *)0x10d066;
        pkcs7_verify_unwrap_cold_5();
      }
      pFVar12 = pFVar10;
      if (w_flag == 0) {
LAB_0010d005:
        pFStack_468 = (FILE *)0x10d00f;
        pFVar17 = (FILE *)b;
        pPVar8 = d2i_PKCS7_bio((BIO *)b,(PKCS7 **)0x0);
        pAVar25[7].flags = (long)pPVar8;
        if (pPVar8 != (PKCS7 *)0x0) {
          pFStack_468 = (FILE *)0x10d027;
          X509_STORE_free(ctx);
          pFStack_468 = (FILE *)0x10d02f;
          X509_STORE_CTX_cleanup(ctx_00);
          return 0;
        }
        pFStack_468 = (FILE *)0x10d0ba;
        pkcs7_verify_unwrap_cold_8();
        pFVar10 = pFVar12;
LAB_0010d0ba:
        pFVar12 = pFVar10;
        pFStack_468 = (FILE *)0x10d0bf;
        pkcs7_verify_unwrap_cold_7();
      }
      else {
        pFStack_468 = (FILE *)0x10cf6d;
        pFVar17 = (FILE *)w_char;
        pFVar12 = fopen(w_char,"w");
        if (pFVar12 == (FILE *)0x0) goto LAB_0010d0ba;
        if (v_flag != 0) {
          pFStack_468 = (FILE *)0x10cf9d;
          printf("%s: writing cert\n",w_char);
        }
        if (d_flag != 0) {
          pFStack_468 = (FILE *)0x10cfbb;
          PEM_write_X509(_stdout,(X509 *)pFVar11);
        }
        pFStack_468 = (FILE *)0x10cfc6;
        pFVar17 = pFVar12;
        iVar2 = PEM_write_X509(pFVar12,(X509 *)pFVar11);
        if (iVar2 == 1) {
          if (v_flag != 0) {
            pFStack_468 = (FILE *)0x10cffd;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          pFStack_468 = (FILE *)0x10d005;
          fclose(pFVar12);
          goto LAB_0010d005;
        }
      }
      pFStack_468 = (FILE *)pkcs7_unwrap;
      pkcs7_verify_unwrap_cold_6();
      pFStack_8b0 = (FILE *)0x10d0dd;
      pAStack_490 = pAVar25;
      pFStack_488 = pFVar11;
      pXStack_480 = ctx;
      pXStack_478 = ctx_00;
      pFStack_470 = (FILE *)b;
      pFStack_468 = pFVar12;
      pBVar6 = BIO_s_mem();
      pFStack_8b0 = (FILE *)0x10d0e5;
      pFVar10 = (FILE *)BIO_new(pBVar6);
      cert = &v_flag;
      if (v_flag != 0) {
        pFStack_8b0 = (FILE *)0x10d10e;
        printf("%s: reading outer PKCS#7\n",pname);
      }
      pFVar24 = *(FILE **)&pFVar17->_mode;
      pFStack_8b0 = (FILE *)0x10d123;
      pcVar26 = (char *)pFVar10;
      uVar3 = BIO_write((BIO *)pFVar10,pFVar24,*(int *)(pFVar17->_unused2 + 4));
      if ((int)uVar3 < 1) {
        pFStack_8b0 = (FILE *)0x10d77a;
        pkcs7_unwrap_cold_21();
LAB_0010d77a:
        pFStack_8b0 = (FILE *)0x10d77f;
        pkcs7_unwrap_cold_1();
LAB_0010d77f:
        pFStack_8b0 = (FILE *)0x10d784;
        pkcs7_unwrap_cold_20();
LAB_0010d784:
        pFStack_8b0 = (FILE *)0x10d789;
        pkcs7_unwrap_cold_19();
LAB_0010d789:
        pFStack_8b0 = (FILE *)0x10d78e;
        pkcs7_unwrap_cold_18();
LAB_0010d78e:
        pFStack_8b0 = (FILE *)0x10d793;
        pkcs7_unwrap_cold_17();
LAB_0010d793:
        pcVar4 = (char *)pFVar11;
        pFStack_8b0 = (FILE *)0x10d798;
        pkcs7_unwrap_cold_2();
LAB_0010d798:
        pFStack_8b0 = (FILE *)0x10d79d;
        pkcs7_unwrap_cold_3();
LAB_0010d79d:
        pFStack_8b0 = (FILE *)0x10d7a2;
        pkcs7_unwrap_cold_4();
LAB_0010d7a2:
        pFStack_8b0 = (FILE *)0x10d7a7;
        pkcs7_unwrap_cold_5();
LAB_0010d7a7:
        pFStack_8b0 = (FILE *)0x10d7ac;
        pkcs7_unwrap_cold_7();
LAB_0010d7ac:
        pFStack_8b0 = (FILE *)0x10d7b1;
        pkcs7_unwrap_cold_9();
LAB_0010d7b1:
        pFStack_8b0 = (FILE *)0x10d7b6;
        pkcs7_unwrap_cold_10();
LAB_0010d7b6:
        pFStack_8b0 = (FILE *)0x10d7bb;
        pkcs7_unwrap_cold_11();
LAB_0010d7bb:
        pFStack_8b0 = (FILE *)0x10d7c0;
        pkcs7_unwrap_cold_15();
LAB_0010d7c0:
        pFVar11 = pFVar12;
        pFStack_8b0 = (FILE *)0x10d7c5;
        pkcs7_unwrap_cold_14();
LAB_0010d7c5:
        pFStack_8b0 = (FILE *)0x10d7ca;
        pkcs7_unwrap_cold_13();
      }
      else {
        if (v_flag != 0) {
          ppcVar21 = &pname;
          pFStack_8b0 = (FILE *)0x10d14c;
          printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
          buffer_00 = (EVP_PKEY **)ppcVar21;
        }
        pFStack_8b0 = (FILE *)0x10d159;
        BIO_set_flags((BIO *)pFVar10,0x200);
        pFVar24 = (FILE *)0x0;
        pFStack_8b0 = (FILE *)0x10d163;
        pPVar8 = d2i_PKCS7_bio((BIO *)pFVar10,(PKCS7 **)0x0);
        pFVar17->__pad5 = (size_t)pPVar8;
        if (d_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d18e;
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          pFVar24 = (FILE *)pFVar17->__pad5;
          pFStack_8b0 = (FILE *)0x10d1a4;
          PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar24);
        }
        pcVar26 = *(char **)(pFVar17->__pad5 + 0x18);
        pFStack_8b0 = (FILE *)0x10d1b4;
        iVar2 = OBJ_obj2nid((ASN1_OBJECT *)pcVar26);
        if (iVar2 != 0x16) goto LAB_0010d77a;
        pcVar26 = (char *)pFVar17->__pad5;
        pFVar24 = (FILE *)0x0;
        pFStack_8b0 = (FILE *)0x10d1cb;
        b_00 = (FILE *)PKCS7_dataInit((PKCS7 *)pcVar26,(BIO *)0x0);
        if (b_00 == (FILE *)0x0) goto LAB_0010d77f;
        pFStack_8b0 = (FILE *)0x10d1dc;
        pBVar6 = BIO_s_mem();
        pFStack_8b0 = (FILE *)0x10d1e4;
        pFVar10 = (FILE *)BIO_new(pBVar6);
        pFStack_8b0 = (FILE *)0x10d1f9;
        uVar3 = BIO_read((BIO *)b_00,auStack_8a0 + 8,0x400);
        pFVar24 = (FILE *)(ulong)uVar3;
        pFVar12 = pFVar24;
        if (0 < (int)uVar3) {
          pFVar11 = (FILE *)(auStack_8a0 + 8);
          do {
            pFStack_8b0 = (FILE *)0x10d213;
            BIO_write((BIO *)pFVar10,pFVar11,(int)pFVar24);
            pFStack_8b0 = (FILE *)0x10d223;
            uVar3 = BIO_read((BIO *)b_00,pFVar11,0x400);
            pFVar24 = (FILE *)(ulong)uVar3;
            pFVar12 = (FILE *)(ulong)((int)pFVar12 + uVar3);
          } while (0 < (int)uVar3);
        }
        pFVar24 = (FILE *)0xb;
        buffer_00 = (EVP_PKEY **)0x0;
        pFStack_8b0 = (FILE *)0x10d23a;
        BIO_ctrl((BIO *)pFVar10,0xb,0,(void *)0x0);
        if (v_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d25b;
          pFVar24 = (FILE *)pname;
          printf("%s: PKCS#7 contains %d bytes of enveloped data\n",pname,pFVar12);
        }
        pcVar26 = (char *)pFVar17->__pad5;
        pFStack_8b0 = (FILE *)0x10d267;
        psVar9 = PKCS7_get_signer_info((PKCS7 *)pcVar26);
        b = (char **)b_00;
        if (psVar9 == (stack_st_PKCS7_SIGNER_INFO *)0x0) goto LAB_0010d784;
        if (v_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d292;
          printf("%s: verifying signature\n",pname);
        }
        pFStack_8b0 = (FILE *)0x10d29c;
        pFVar11 = (FILE *)OPENSSL_sk_value(psVar9,0);
        pFVar24 = (FILE *)pFVar17->__pad5;
        pFStack_8b0 = (FILE *)0x10d2bb;
        buffer_00 = (EVP_PKEY **)cacert;
        pcVar26 = (char *)b_00;
        iVar2 = PKCS7_signatureVerify
                          ((BIO *)b_00,(PKCS7 *)pFVar24,(PKCS7_SIGNER_INFO *)pFVar11,(X509 *)cacert)
        ;
        if (iVar2 < 1) goto LAB_0010d789;
        if (v_flag != 0) {
          pcVar26 = "%s: signature ok\n";
          pFStack_8b0 = (FILE *)0x10d2e2;
          pFVar24 = (FILE *)pname;
          printf("%s: signature ok\n");
        }
        if (d_flag != 0) {
          pcVar26 = "%s: finding signed attributes\n";
          pFStack_8b0 = (FILE *)0x10d306;
          pFVar24 = (FILE *)pname;
          printf("%s: finding signed attributes\n");
        }
        b = (char **)pFVar11->_IO_read_base;
        if ((FILE *)b == (FILE *)0x0) goto LAB_0010d78e;
        pFVar24 = (FILE *)(ulong)(uint)nid_transId;
        buffer_00 = (EVP_PKEY **)auStack_8a0;
        pFStack_8b0 = (FILE *)0x10d32f;
        pcVar26 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_transId,0x13,(char **)buffer_00);
        pcVar4 = (char *)auStack_8a0._0_8_;
        if (iVar2 != 0) goto LAB_0010d793;
        pFStack_8b0 = (FILE *)0x10d357;
        printf("%s: reply transaction id: %s\n",pname,auStack_8a0._0_8_);
        cert = (int *)pFVar17->_IO_buf_end;
        pFStack_8b0 = (FILE *)0x10d363;
        __n = strlen(pcVar4);
        pFStack_8b0 = (FILE *)0x10d371;
        pFVar24 = (FILE *)pcVar4;
        pcVar26 = (char *)cert;
        iVar2 = strncmp((char *)cert,pcVar4,__n);
        if (iVar2 != 0) goto LAB_0010d798;
        pFVar24 = (FILE *)(ulong)(uint)nid_messageType;
        buffer_00 = (EVP_PKEY **)auStack_8a0;
        pFStack_8b0 = (FILE *)0x10d394;
        pcVar26 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_messageType,0x13,(char **)buffer_00);
        cert = &v_flag;
        if (iVar2 != 0) goto LAB_0010d79d;
        pFStack_8b0 = (FILE *)0x10d3ad;
        pcVar26 = (char *)auStack_8a0._0_8_;
        iVar2 = atoi((char *)auStack_8a0._0_8_);
        if (iVar2 != 3) goto LAB_0010d7a2;
        if (v_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d3d5;
          printf("%s: reply message type is good\n",pname);
        }
        pFStack_8b0 = (FILE *)0x10d3f0;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_senderNonce,4,(char **)auStack_8a0);
        if ((iVar2 != 0) && (v_flag != 0)) {
          pFStack_8b0 = (FILE *)0x10d766;
          pkcs7_unwrap_cold_6();
        }
        pFVar17->_markers = (_IO_marker *)auStack_8a0._0_8_;
        if (v_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d427;
          printf("%s: senderNonce in reply: ",pname);
          pcVar4 = "%02X";
          lVar28 = 0;
          do {
            pFStack_8b0 = (FILE *)0x10d444;
            printf("%02X",(ulong)*(byte *)((long)&pFVar17->_markers->_next + lVar28));
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x10);
          pFStack_8b0 = (FILE *)0x10d457;
          putchar(10);
        }
        cert = &v_flag;
        pFVar24 = (FILE *)(ulong)(uint)nid_recipientNonce;
        buffer_00 = (EVP_PKEY **)auStack_8a0;
        pFStack_8b0 = (FILE *)0x10d479;
        pcVar26 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_recipientNonce,4,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d7a7;
        pFVar17->_IO_save_end = (char *)auStack_8a0._0_8_;
        if (v_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d4a9;
          printf("%s: recipientNonce in reply: ",pname);
          lVar28 = 0;
          do {
            pFStack_8b0 = (FILE *)0x10d4c6;
            printf("%02X",(ulong)(byte)pFVar17->_IO_save_end[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x10);
          pFStack_8b0 = (FILE *)0x10d4d9;
          putchar(10);
        }
        cert = &v_flag;
        pcVar4 = (char *)&pFVar17->_mode;
        lVar28 = 0;
        do {
          if (pFVar17->_IO_save_base[lVar28] != pFVar17->_IO_save_end[lVar28]) {
            if (v_flag != 0) {
              pFStack_8b0 = (FILE *)0x10d770;
              pkcs7_unwrap_cold_8();
            }
            break;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0x10);
        pFVar24 = (FILE *)(ulong)(uint)nid_pkiStatus;
        buffer_00 = (EVP_PKEY **)auStack_8a0;
        pFStack_8b0 = (FILE *)0x10d52c;
        pcVar26 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_pkiStatus,0x13,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d7ac;
        pFStack_8b0 = (FILE *)0x10d53e;
        pcVar26 = (char *)auStack_8a0._0_8_;
        uVar3 = atoi((char *)auStack_8a0._0_8_);
        cert = (int *)(ulong)uVar3;
        if (uVar3 == 0) {
          pcVar26 = "%s: pkistatus: SUCCESS\n";
LAB_0010d56e:
          pFStack_8b0 = (FILE *)0x10d57f;
          pFVar24 = (FILE *)pname;
          printf(pcVar26);
          *(uint *)&pFVar17->_IO_write_base = uVar3;
          cert = &v_flag;
          if (uVar3 == 2) {
            pFVar24 = (FILE *)(ulong)(uint)nid_failInfo;
            buffer_00 = (EVP_PKEY **)auStack_8a0;
            pFStack_8b0 = (FILE *)0x10d5ab;
            pcVar26 = (char *)b;
            iVar2 = get_signed_attribute
                              ((stack_st_X509_ATTRIBUTE *)b,nid_failInfo,0x13,(char **)buffer_00);
            if (iVar2 != 0) goto LAB_0010d7b1;
            pFStack_8b0 = (FILE *)0x10d5bd;
            uVar3 = atoi((char *)auStack_8a0._0_8_);
            pcVar26 = (char *)auStack_8a0._0_8_;
            if (uVar3 < 5) {
              buffer_00 = (EVP_PKEY **)(ulong)uVar3;
              iVar2 = *(int *)(&DAT_0011144c + (long)buffer_00 * 4);
              *(uint *)&pFVar17->_IO_write_end = uVar3;
              pcVar26 = "%s: reason: %s\n";
              pFStack_8b0 = (FILE *)0x10d5f1;
              pFVar24 = (FILE *)pname;
              printf("%s: reason: %s\n",pname,&DAT_0011144c + iVar2);
              goto LAB_0010d5f1;
            }
            goto LAB_0010d7b6;
          }
LAB_0010d5f1:
          if (*(int *)&pFVar17->_IO_write_base != 0) {
            if ((v_flag != 0) && ((int)pFVar12 != 0)) {
              pFStack_8b0 = (FILE *)0x10d60f;
              pkcs7_unwrap_cold_12();
            }
            return 0;
          }
          if ((int)pFVar12 == 0) goto LAB_0010d7bb;
          if (pFVar17->_flags - 0x13U < 2) {
            ppXVar13 = (X509 **)&pFVar17->_fileno;
            buffer_00 = (EVP_PKEY **)&pFVar17->_old_offset;
          }
          else {
            ppXVar13 = &localcert;
            buffer_00 = &rsa;
          }
          b = (char **)*buffer_00;
          cert = (int *)*ppXVar13;
          pFVar24 = (FILE *)0x0;
          pFStack_8b0 = (FILE *)0x10d64e;
          pcVar26 = (char *)pFVar10;
          pFVar11 = (FILE *)d2i_PKCS7_bio((BIO *)pFVar10,(PKCS7 **)0x0);
          if (pFVar11 == (FILE *)0x0) goto LAB_0010d7c0;
          if (d_flag != 0) {
            pFStack_8b0 = (FILE *)0x10d67e;
            printf("%s: printing PEM fomatted PKCS#7\n",pname);
            pFStack_8b0 = (FILE *)0x10d690;
            PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar11);
          }
          pFStack_8b0 = (FILE *)0x10d695;
          pBVar6 = BIO_s_mem();
          pFStack_8b0 = (FILE *)0x10d69d;
          pFVar10 = (FILE *)BIO_new(pBVar6);
          if (d_flag != 0) {
            pFStack_8b0 = (FILE *)0x10d6c4;
            printf("%s: decrypting inner PKCS#7\n",pname);
          }
          pFStack_8b0 = (FILE *)0x10d6d8;
          buffer_00 = (EVP_PKEY **)pFVar10;
          pFVar24 = (FILE *)b;
          pcVar26 = (char *)pFVar11;
          iVar2 = PKCS7_decrypt((PKCS7 *)pFVar11,(EVP_PKEY *)b,(X509 *)cert,(BIO *)pFVar10,0);
          if (iVar2 != 0) {
            pFStack_8b0 = (FILE *)0x10d6f1;
            BIO_ctrl((BIO *)pFVar10,0xb,0,(void *)0x0);
            pFStack_8b0 = (FILE *)0x10d703;
            uVar14 = BIO_ctrl((BIO *)pFVar10,3,0,pcVar4);
            *(int *)(pFVar17->_unused2 + 4) = (int)uVar14;
            if (v_flag != 0) {
              pFStack_8b0 = (FILE *)0x10d72f;
              printf("%s: PKCS#7 payload size: %d bytes\n",pname,uVar14 & 0xffffffff);
            }
            pFStack_8b0 = (FILE *)0x10d73c;
            BIO_set_flags((BIO *)pFVar10,0x200);
            pFStack_8b0 = (FILE *)0x10d746;
            pPVar8 = d2i_PKCS7_bio((BIO *)pFVar10,(PKCS7 **)0x0);
            pFVar17->__pad5 = (size_t)pPVar8;
            return 0;
          }
          goto LAB_0010d7c5;
        }
        if (uVar3 == 3) {
          pcVar26 = "%s: pkistatus: PENDING\n";
          goto LAB_0010d56e;
        }
        pFVar11 = pFVar12;
        if (uVar3 == 2) {
          pcVar26 = "%s: pkistatus: FAILURE\n";
          goto LAB_0010d56e;
        }
      }
      pFStack_8b0 = (FILE *)get_signed_attribute;
      pkcs7_unwrap_cold_16();
      pcStack_8e8 = (code *)0x10d7ea;
      pFStack_8d0 = pFVar17;
      pFStack_8c8 = (FILE *)pcVar4;
      pFStack_8c0 = pFVar10;
      pFStack_8b8 = (FILE *)b;
      pFStack_8b0 = pFVar11;
      iVar2 = get_attribute((stack_st_X509_ATTRIBUTE *)pcVar26,(int)pFVar24,
                            (ASN1_TYPE **)&pFStack_8d8);
      if (iVar2 != 0) {
        if (v_flag == 0) {
          return 1;
        }
        pcStack_8e8 = (code *)0x10d8bf;
        get_signed_attribute_cold_1();
        return 1;
      }
      pcStack_8e8 = (code *)0x10d821;
      ppcVar21 = (char **)pFStack_8d8;
      uVar3 = ASN1_TYPE_get((ASN1_TYPE *)pFStack_8d8);
      if (uVar3 == extraout_EDX) {
        pcStack_8e8 = (code *)0x10d832;
        uVar3 = ASN1_STRING_length((ASN1_STRING *)pFStack_8d8->_IO_read_ptr);
        if ((int)uVar3 < 1) {
          return 1;
        }
        b = (char **)(ulong)uVar3;
        if (d_flag != 0) {
          pcStack_8e8 = (code *)0x10d860;
          pFVar24 = (FILE *)pname;
          printf("%s: allocating %d bytes for attribute\n",pname,b);
        }
        ppcVar21 = (char **)(ulong)((extraout_EDX == 0x13) + uVar3);
        pcStack_8e8 = (code *)0x10d871;
        pcVar26 = (char *)malloc((size_t)ppcVar21);
        *buffer_00 = (EVP_PKEY *)pcVar26;
        if (pcVar26 != (char *)0x0) {
          pcStack_8e8 = (code *)0x10d885;
          __src = (void *)ASN1_STRING_get0_data((X509_ALGOR *)pFStack_8d8->_IO_read_ptr);
          pcStack_8e8 = (code *)0x10d896;
          memcpy(pcVar26,__src,(size_t)b);
          if (extraout_EDX != 0x13) {
            return 0;
          }
          (*buffer_00)[(long)b] = (EVP_PKEY)0x0;
          return 0;
        }
      }
      else {
        pcStack_8e8 = (code *)0x10d8c9;
        get_signed_attribute_cold_2();
      }
      pcStack_8e8 = get_attribute;
      get_signed_attribute_cold_3();
      pcVar26 = pname;
      pFStack_8f8 = pFStack_8d8;
      pFVar11 = (FILE *)((ulong)pFVar24 & 0xffffffff);
      pFStack_908 = (FILE *)buffer_00;
      pFStack_900 = (FILE *)pcVar4;
      pFStack_8f0 = (FILE *)b;
      pcStack_8e8 = (code *)(ulong)extraout_EDX;
      if (d_flag != 0) {
        pFStack_910 = (FILE *)0x10d8fb;
        pcVar15 = OBJ_nid2sn((int)pFVar24);
        pFStack_910 = (FILE *)0x10d90f;
        printf("%s: finding attribute %s\n",pcVar26,pcVar15);
        b = (char **)pcVar26;
      }
      *(long *)extraout_RDX = 0;
      pFStack_910 = (FILE *)0x10d91d;
      pFVar10 = pFVar11;
      pFVar12 = (FILE *)OBJ_nid2obj((int)pFVar24);
      if (pFVar12 != (FILE *)0x0) {
        pFStack_910 = (FILE *)0x10d92d;
        iVar2 = OPENSSL_sk_num(ppcVar21);
        if (0 < iVar2) {
          pFVar11 = (FILE *)0x0;
          do {
            pFStack_910 = (FILE *)0x10d93d;
            pcVar4 = (char *)OPENSSL_sk_value(ppcVar21,pFVar11);
            pFStack_910 = (FILE *)0x10d948;
            a = X509_ATTRIBUTE_get0_object((X509_ATTRIBUTE *)pcVar4);
            pFStack_910 = (FILE *)0x10d953;
            iVar2 = OBJ_cmp(a,(ASN1_OBJECT *)pFVar12);
            if (iVar2 == 0) {
              pFStack_910 = (FILE *)0x10d95f;
              pFVar10 = (FILE *)pcVar4;
              iVar2 = X509_ATTRIBUTE_count((X509_ATTRIBUTE *)pcVar4);
              if (iVar2 != 0) {
                if (*(long *)extraout_RDX != 0) {
                  pFStack_910 = (FILE *)0x10d99b;
                  get_attribute_cold_1();
                  b = (char **)pFVar12;
                  goto LAB_0010d99b;
                }
                pFStack_910 = (FILE *)0x10d973;
                pAVar16 = X509_ATTRIBUTE_get0_type((X509_ATTRIBUTE *)pcVar4,0);
                *(ASN1_TYPE **)extraout_RDX = pAVar16;
              }
            }
            uVar3 = (int)pFVar11 + 1;
            pFVar11 = (FILE *)(ulong)uVar3;
            pFStack_910 = (FILE *)0x10d980;
            iVar2 = OPENSSL_sk_num(ppcVar21);
          } while ((int)uVar3 < iVar2);
        }
        return (int)(*(long *)extraout_RDX == 0);
      }
LAB_0010d99b:
      pFStack_910 = (FILE *)write_crl;
      get_attribute_cold_2();
      pFVar10 = *(FILE **)(*(long *)(pFVar10->__pad5 + 0x20) + 0x18);
      pFStack_928 = (FILE *)0x10d9bb;
      pFStack_918 = (FILE *)ppcVar21;
      pFStack_910 = (FILE *)b;
      pFVar12 = (FILE *)OPENSSL_sk_value(pFVar10,0);
      if (pFVar12 == (FILE *)0x0) {
        pFStack_928 = (FILE *)0x10da68;
        write_crl_cold_3();
LAB_0010da68:
        pFStack_928 = (FILE *)0x10da6d;
        write_crl_cold_2();
        pFVar17 = extraout_RDX;
      }
      else {
        b = &w_char;
        pFStack_928 = (FILE *)0x10d9dd;
        pFVar10 = (FILE *)w_char;
        pFVar17 = fopen(w_char,"w");
        ppcVar21 = (char **)pFVar12;
        if (pFVar17 == (FILE *)0x0) goto LAB_0010da68;
        if (v_flag != 0) {
          pFStack_928 = (FILE *)0x10da0d;
          printf("%s: writing CRL\n",pname);
        }
        if (d_flag != 0) {
          pFStack_928 = (FILE *)0x10da2b;
          PEM_write_X509_CRL(_stdout,(X509_CRL *)pFVar12);
        }
        pFStack_928 = (FILE *)0x10da36;
        pFVar10 = pFVar17;
        iVar2 = PEM_write_X509_CRL(pFVar17,(X509_CRL *)pFVar12);
        if (iVar2 == 1) {
          pFStack_928 = (FILE *)0x10da56;
          printf("%s: CRL written as %s\n",pname,w_char);
          iVar2 = fclose(pFVar17);
          return iVar2;
        }
      }
      pFStack_928 = (FILE *)write_local_cert;
      write_crl_cold_1();
      localcert = (X509 *)0x0;
      pFVar10 = *(FILE **)(*(long *)(pFVar10->__pad5 + 0x20) + 0x10);
      piVar27 = &v_flag;
      pFStack_950 = pFVar17;
      pFStack_948 = (FILE *)pcVar4;
      pFStack_940 = (FILE *)cert;
      pFStack_938 = (FILE *)ppcVar21;
      pFStack_930 = (FILE *)b;
      pFStack_928 = pFVar11;
      if (v_flag != 0) {
        pFStack_1960 = (FILE *)0x10dab3;
        uVar3 = OPENSSL_sk_num(pFVar10);
        pFStack_1960 = (FILE *)0x10dac3;
        printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar3);
      }
      pFStack_1960 = (FILE *)0x10dacb;
      pFVar12 = pFVar10;
      iVar2 = OPENSSL_sk_num();
      pFVar17 = (FILE *)localcert;
      if (0 < iVar2) {
        ppcVar21 = (char **)0x0;
        do {
          pFStack_1960 = (FILE *)0x10dae1;
          cert = (int *)OPENSSL_sk_value(pFVar10,ppcVar21);
          pcVar26 = pname;
          if (v_flag != 0) {
            pFStack_1960 = (FILE *)0x10db01;
            pXVar18 = X509_get_subject_name((X509 *)cert);
            pFStack_1960 = (FILE *)0x10db14;
            pcVar4 = X509_NAME_oneline(pXVar18,(char *)aFStack_1958,0x400);
            pFStack_1960 = (FILE *)0x10db28;
            printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar26,pcVar4);
            pFStack_1960 = (FILE *)0x10db30;
            pXVar18 = X509_get_issuer_name((X509 *)cert);
            pFStack_1960 = (FILE *)0x10db40;
            pcVar26 = X509_NAME_oneline(pXVar18,(char *)aFStack_1958,0x400);
            pFStack_1960 = (FILE *)0x10db51;
            printf("  issuer: %s\n",pcVar26);
            pFStack_1960 = (FILE *)0x10db5d;
            pXVar18 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFStack_1960 = (FILE *)0x10db6d;
            pcVar26 = X509_NAME_oneline(pXVar18,(char *)aFStack_1958,0x400);
            pFStack_1960 = (FILE *)0x10db7e;
            printf("  request_subject: \'%s\'\n",pcVar26);
            pFVar11 = aFStack_1958;
          }
          pFStack_1960 = (FILE *)0x10db86;
          pXVar18 = X509_get_subject_name((X509 *)cert);
          pFStack_1960 = (FILE *)0x10db95;
          b_01 = (X509_NAME *)X509_REQ_get_subject_name(request);
          pFStack_1960 = (FILE *)0x10dba0;
          iVar2 = X509_NAME_cmp(pXVar18,b_01);
          if (d_flag != 0) {
            pFStack_1960 = (FILE *)0x10dc81;
            write_local_cert_cold_1();
          }
          if (iVar2 == 0) {
LAB_0010dc26:
            if (v_flag != 0) {
              pFStack_1960 = (FILE *)0x10dc39;
              puts("CN\'s of request and certificate matched!");
            }
          }
          else {
            pFStack_1960 = (FILE *)0x10dbc0;
            pXVar18 = X509_get_subject_name((X509 *)cert);
            pFStack_1960 = (FILE *)0x10dbd8;
            X509_NAME_oneline(pXVar18,acStack_1158,0x400);
            pFStack_1960 = (FILE *)0x10dbe4;
            pXVar18 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFVar11 = aFStack_1558;
            pFStack_1960 = (FILE *)0x10dbfc;
            X509_NAME_oneline(pXVar18,(char *)pFVar11,0x400);
            if (v_flag != 0) {
              pFStack_1960 = (FILE *)0x10dc17;
              printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n"
                     ,pFVar11,acStack_1158);
            }
            pFStack_1960 = (FILE *)0x10dc22;
            iVar2 = strcmp(acStack_1158,(char *)pFVar11);
            if (iVar2 == 0) goto LAB_0010dc26;
            pFStack_1960 = (FILE *)0x10dc8b;
            write_local_cert_cold_2();
          }
          pFStack_1960 = (FILE *)0x10dc41;
          b = (char **)X509_get_subject_name((X509 *)cert);
          pFStack_1960 = (FILE *)0x10dc4c;
          pXVar18 = X509_get_issuer_name((X509 *)cert);
          pFStack_1960 = (FILE *)0x10dc57;
          pFVar12 = (FILE *)b;
          iVar2 = X509_NAME_cmp((X509_NAME *)b,pXVar18);
          pFVar17 = (FILE *)cert;
          if (iVar2 != 0) break;
          uVar3 = (int)ppcVar21 + 1;
          ppcVar21 = (char **)(ulong)uVar3;
          pFStack_1960 = (FILE *)0x10dc66;
          pFVar12 = pFVar10;
          iVar2 = OPENSSL_sk_num();
          pFVar17 = (FILE *)localcert;
        } while ((int)uVar3 < iVar2);
      }
      localcert = (X509 *)pFVar17;
      if (localcert == (X509 *)0x0) {
        pFStack_1960 = (FILE *)0x10dd37;
        write_local_cert_cold_5();
LAB_0010dd37:
        pFStack_1960 = (FILE *)0x10dd3c;
        write_local_cert_cold_4();
      }
      else {
        ppcVar21 = &l_char;
        pFStack_1960 = (FILE *)0x10dcb8;
        pFVar12 = (FILE *)l_char;
        pFVar17 = fopen(l_char,"w");
        if (pFVar17 == (FILE *)0x0) goto LAB_0010dd37;
        if (v_flag != 0) {
          pFStack_1960 = (FILE *)0x10dce2;
          printf("%s: certificate written as %s\n",pname,l_char);
        }
        if (d_flag != 0) {
          pFStack_1960 = (FILE *)0x10dd04;
          PEM_write_X509(_stdout,(X509 *)localcert);
        }
        pFStack_1960 = (FILE *)0x10dd13;
        pFVar12 = pFVar17;
        iVar2 = PEM_write_X509(pFVar17,(X509 *)localcert);
        pFVar10 = pFVar17;
        if (iVar2 == 1) {
          pFStack_1960 = (FILE *)0x10dd20;
          iVar2 = fclose(pFVar17);
          return iVar2;
        }
      }
      pFStack_1960 = (FILE *)write_other_cert;
      write_local_cert_cold_3();
      piStack_1980 = &v_flag;
      ppcVar29 = *(char ***)(*(long *)(pFVar12->__pad5 + 0x20) + 0x10);
      pFStack_1da8 = (FILE *)0x10dd6e;
      pFVar17 = (FILE *)ppcVar29;
      pFStack_1d98 = pFVar12;
      pFStack_1988 = pFVar10;
      pFStack_1978 = (FILE *)cert;
      pFStack_1970 = (FILE *)ppcVar21;
      pFStack_1968 = (FILE *)b;
      pFStack_1960 = pFVar11;
      iVar2 = OPENSSL_sk_num();
      pFVar10 = (FILE *)0x0;
      if (0 < iVar2) {
        cert = (int *)0x0;
        do {
          pFStack_1da8 = (FILE *)0x10dd86;
          pFVar11 = (FILE *)OPENSSL_sk_value(ppcVar29,cert);
          pcVar26 = pname;
          if (v_flag != 0) {
            pFStack_1da8 = (FILE *)0x10dda7;
            pXVar18 = X509_get_subject_name((X509 *)pFVar11);
            ppcVar21 = (char **)aFStack_1d90;
            pFStack_1da8 = (FILE *)0x10ddbc;
            pcVar4 = X509_NAME_oneline(pXVar18,(char *)ppcVar21,0x400);
            pFStack_1da8 = (FILE *)0x10ddd0;
            printf("%s: found certificate with\n  subject: %s\n",pcVar26,pcVar4);
            pFStack_1da8 = (FILE *)0x10ddd8;
            pXVar18 = X509_get_issuer_name((X509 *)pFVar11);
            pFStack_1da8 = (FILE *)0x10dde8;
            pcVar4 = X509_NAME_oneline(pXVar18,(char *)ppcVar21,0x400);
            pFStack_1da8 = (FILE *)0x10ddf9;
            printf("  issuer: %s\n",pcVar4);
            piVar27 = (int *)pcVar26;
          }
          pFStack_1da8 = (FILE *)0x10de01;
          pFVar17 = (FILE *)X509_get_serialNumber((X509 *)pFVar11);
          pFStack_1da8 = (FILE *)0x10de19;
          iVar2 = ASN1_INTEGER_cmp((ASN1_INTEGER *)pFVar17,
                                   *(ASN1_INTEGER **)((long)pFStack_1d98->__pad3 + 8));
          pFVar10 = pFVar11;
          if (iVar2 == 0) break;
          uVar3 = (int)cert + 1;
          cert = (int *)(ulong)uVar3;
          pFStack_1da8 = (FILE *)0x10de2c;
          pFVar17 = (FILE *)ppcVar29;
          iVar2 = OPENSSL_sk_num();
          pFVar10 = (FILE *)0x0;
        } while ((int)uVar3 < iVar2);
      }
      if (pFVar10 == (FILE *)0x0) {
        pFStack_1da8 = (FILE *)0x10ded0;
        write_other_cert_cold_3();
      }
      else {
        ppcVar29 = &w_char;
        pFStack_1da8 = (FILE *)0x10de54;
        pFVar17 = (FILE *)w_char;
        pFVar12 = fopen(w_char,"w");
        if (pFVar12 != (FILE *)0x0) {
          if (v_flag != 0) {
            pFStack_1da8 = (FILE *)0x10de83;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          if (d_flag != 0) {
            pFStack_1da8 = (FILE *)0x10dea1;
            PEM_write_X509(_stdout,(X509 *)pFVar10);
          }
          pFStack_1da8 = (FILE *)0x10deac;
          pFVar17 = pFVar12;
          iVar2 = PEM_write_X509(pFVar12,(X509 *)pFVar10);
          ppcVar21 = (char **)pFVar12;
          if (iVar2 == 1) {
            pFStack_1da8 = (FILE *)0x10deb9;
            iVar2 = fclose(pFVar12);
            return iVar2;
          }
          goto LAB_0010ded5;
        }
      }
      pFStack_1da8 = (FILE *)0x10ded5;
      write_other_cert_cold_2();
LAB_0010ded5:
      pFStack_1da8 = (FILE *)write_ca_ra;
      write_other_cert_cold_1();
      pFStack_1dd0 = pFVar10;
      piStack_1dc8 = piVar27;
      pFStack_1dc0 = (FILE *)cert;
      pFStack_1db8 = (FILE *)ppcVar21;
      pFStack_1db0 = (FILE *)ppcVar29;
      pFStack_1da8 = pFVar11;
      pBVar7 = BIO_new_mem_buf(pFVar17->_IO_read_end,*(int *)&pFVar17->_IO_read_base);
      pPVar8 = d2i_PKCS7_bio(pBVar7,(PKCS7 **)0x0);
      if (pPVar8 == (PKCS7 *)0x0) {
        pcVar26 = "%s: error reading PKCS#7 data\n";
LAB_0010df27:
        fprintf(_stderr,pcVar26,pname);
LAB_0010df31:
        ERR_print_errors_fp(_stderr);
      }
      else {
        iVar2 = OBJ_obj2nid(pPVar8->type);
        if (iVar2 == 0x16) {
          lVar28 = ((pPVar8->d).data)->flags;
          if (lVar28 != 0) {
            pPStack_2630 = pPVar8;
            pBStack_2628 = pBVar7;
            iVar2 = OPENSSL_sk_num(lVar28);
            if (0 < iVar2) {
              uVar14 = 0;
              lStack_2620 = lVar28;
              do {
                memset(acStack_25d8,0,0x400);
                memset(acStack_21d8,0,0x400);
                a_00 = (X509 *)OPENSSL_sk_value(lVar28,uVar14);
                snprintf(acStack_21d8,0x400,"%s-%d",c_char,uVar14);
                pcVar26 = pname;
                if (v_flag != 0) {
                  pXVar18 = X509_get_subject_name(a_00);
                  pcVar4 = X509_NAME_oneline(pXVar18,acStack_25d8,0x400);
                  printf("\n%s: found certificate with\n  subject: %s\n",pcVar26,pcVar4);
                }
                if (v_flag != 0) {
                  pXVar18 = X509_get_issuer_name(a_00);
                  pcVar26 = X509_NAME_oneline(pXVar18,acStack_25d8,0x400);
                  printf("  issuer: %s\n",pcVar26);
                }
                iVar2 = X509_digest(a_00,(EVP_MD *)fp_alg,abStack_2618,&uStack_2634);
                if (iVar2 == 0) goto LAB_0010df31;
                iVar2 = X509_get_ext_by_NID(a_00,0x57,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  basic constraints: (not included)");
                  }
                }
                else {
                  pXVar19 = X509_get_ext(a_00,iVar2);
                  if (v_flag != 0) {
                    printf("  basic constraints: ");
                    X509V3_EXT_print_fp(_stdout,pXVar19,0,0);
                    putchar(10);
                  }
                }
                iVar2 = X509_get_ext_by_NID(a_00,0x53,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  usage: (not included)");
                  }
                }
                else {
                  pXVar19 = X509_get_ext(a_00,iVar2);
                  if (v_flag != 0) {
                    printf("  usage: ");
                    X509V3_EXT_print_fp(_stdout,pXVar19,0,0);
                    putchar(10);
                  }
                }
                if (v_flag != 0) {
                  iVar2 = EVP_MD_get_type(fp_alg);
                  pcVar26 = OBJ_nid2sn(iVar2);
                  printf("  %s fingerprint: ",pcVar26);
                  uVar22 = (ulong)uStack_2634;
                  if (0 < (int)uStack_2634) {
                    uVar20 = 0;
                    do {
                      uVar1 = uVar20 + 1;
                      uVar23 = 10;
                      if (uVar1 != (uVar22 & 0xffffffff)) {
                        uVar23 = 0x3a;
                      }
                      printf("%02X%c",(ulong)abStack_2618[uVar20],uVar23);
                      uVar22 = (ulong)(int)uStack_2634;
                      uVar20 = uVar1;
                    } while ((long)uVar1 < (long)uVar22);
                  }
                }
                pFVar11 = fopen(acStack_21d8,"w");
                if (pFVar11 == (FILE *)0x0) {
                  pcVar26 = "%s: cannot open cert file for writing\n";
                  goto LAB_0010df71;
                }
                if (v_flag != 0) {
                  printf("%s: certificate written as %s\n",pname,acStack_21d8);
                }
                if (d_flag != 0) {
                  PEM_write_X509(_stdout,a_00);
                }
                iVar2 = PEM_write_X509(pFVar11,a_00);
                if (iVar2 != 1) {
                  pcVar26 = "%s: error while writing certificate file\n";
                  goto LAB_0010df27;
                }
                fclose(pFVar11);
                lVar28 = lStack_2620;
                uVar3 = (int)uVar14 + 1;
                uVar14 = (ulong)uVar3;
                iVar2 = OPENSSL_sk_num(lStack_2620);
              } while ((int)uVar3 < iVar2);
            }
            PKCS7_free(pPStack_2630);
            BIO_free(pBStack_2628);
            exit(0);
          }
          pcVar26 = "%s: cannot find certificates\n";
LAB_0010df71:
          fprintf(_stderr,pcVar26,pname);
        }
        else {
          printf("%s: wrong PKCS#7 type\n",pname);
        }
      }
      exit(0x5d);
    }
  }
  pFStack_468 = (FILE *)0x10d084;
  pkcs7_verify_unwrap_cold_9();
LAB_0010d084:
  pFStack_468 = (FILE *)0x10d09c;
  printf("%s: error verifying signature Error \n",pname);
  pFStack_468 = (FILE *)0x10d0ab;
  ERR_print_errors_fp(_stderr);
  pFStack_468 = (FILE *)0x10d0b5;
  exit(0x61);
}

Assistant:

int add_attribute_octet(STACK_OF(X509_ATTRIBUTE) *attrs, int nid, unsigned char *buffer,
		int len) {
	ASN1_STRING     *asn1_string = NULL;
	X509_ATTRIBUTE  *x509_a;
	int		c;

	if (d_flag)
		printf("%s: adding octet attribute %s\n", pname,
			OBJ_nid2sn(nid));

	asn1_string = ASN1_STRING_new();
	if ((c = ASN1_STRING_set(asn1_string, buffer, len)) <= 0) {
		fprintf(stderr, "%s: error adding data to ASN.1 string\n",
			pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	x509_a = X509_ATTRIBUTE_create(nid, V_ASN1_OCTET_STRING,
		asn1_string);
	sk_X509_ATTRIBUTE_push(attrs, x509_a);
	return (0);

}